

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unsetJoinExpr(Expr *p,int iTable)

{
  int local_18;
  int i;
  int iTable_local;
  Expr *p_local;
  
  for (_i = p; _i != (Expr *)0x0; _i = _i->pRight) {
    if (((_i->flags & 1) != 0) && ((iTable < 0 || (_i->iRightJoinTable == iTable)))) {
      _i->flags = _i->flags & 0xfffffffe;
    }
    if ((_i->op == 0xa1) && ((_i->x).pList != (ExprList *)0x0)) {
      for (local_18 = 0; local_18 < ((_i->x).pList)->nExpr; local_18 = local_18 + 1) {
        unsetJoinExpr(((_i->x).pList)->a[local_18].pExpr,iTable);
      }
    }
    unsetJoinExpr(_i->pLeft,iTable);
  }
  return;
}

Assistant:

static void unsetJoinExpr(Expr *p, int iTable){
  while( p ){
    if( ExprHasProperty(p, EP_FromJoin)
     && (iTable<0 || p->iRightJoinTable==iTable) ){
      ExprClearProperty(p, EP_FromJoin);
    }
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        unsetJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    unsetJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}